

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::iostream_cs_ext::fstream(string *path,openmode openmode)

{
  _Ios_Openmode _Var1;
  basic_ifstream<char,_std::char_traits<char>_> **args;
  void *this;
  lang_error *this_00;
  _Ios_Openmode in_EDX;
  string *in_RSI;
  proxy *in_RDI;
  string *in_stack_ffffffffffffff68;
  basic_ofstream<char,_std::char_traits<char>_> **in_stack_ffffffffffffff88;
  allocator local_59;
  string local_58 [32];
  void *local_38;
  basic_ifstream<char,_std::char_traits<char>_> **local_20;
  _Ios_Openmode local_14;
  string *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  _Var1 = std::operator&(in_EDX,_S_in);
  if (_Var1 == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
    _Var1 = std::operator&(local_14,_S_out);
    if (_Var1 == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
      _Var1 = std::operator&(local_14,_S_app);
      if (_Var1 == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
        this_00 = (lang_error *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_58,"Unsupported openmode.",&local_59);
        cs::lang_error::lang_error(this_00,in_stack_ffffffffffffff68);
        __cxa_throw(this_00,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
      }
    }
    this = operator_new(0x200);
    std::ofstream::ofstream(this,local_10,local_14);
    local_38 = this;
    any::make<std::shared_ptr<std::ostream>,std::ofstream*>(in_stack_ffffffffffffff88);
  }
  else {
    args = (basic_ifstream<char,_std::char_traits<char>_> **)operator_new(0x208);
    std::ifstream::ifstream(args,local_10,local_14);
    local_20 = args;
    any::make<std::shared_ptr<std::istream>,std::ifstream*>(args);
  }
  return (var)in_RDI;
}

Assistant:

var fstream(const string &path, std::ios_base::openmode openmode)
		{
			if (openmode & std::ios_base::in)
				return var::make<istream>(new std::ifstream(path, openmode));
			else if (openmode & std::ios_base::out || openmode & std::ios_base::app)
				return var::make<ostream>(new std::ofstream(path, openmode));
			else
				throw lang_error("Unsupported openmode.");
		}